

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderIncrRead(Fts3SegReader *pReader)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  sqlite3_blob *unaff_retaddr;
  int rc;
  int nRead;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (*(int *)(in_RDI + 0x30) - *(int *)(in_RDI + 0x34) < 0x1000) {
    iVar1 = *(int *)(in_RDI + 0x30) - *(int *)(in_RDI + 0x34);
  }
  else {
    iVar1 = 0x1000;
  }
  iVar2 = sqlite3_blob_read((sqlite3_blob *)CONCAT44(iVar1,0xaaaaaaaa),
                            (void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),0,0x242588);
  if (iVar2 == 0) {
    *(int *)(in_RDI + 0x34) = iVar1 + *(int *)(in_RDI + 0x34);
    memset((void *)(*(long *)(in_RDI + 0x28) + (long)*(int *)(in_RDI + 0x34)),0,0x14);
    if (*(int *)(in_RDI + 0x34) == *(int *)(in_RDI + 0x30)) {
      sqlite3_blob_close(unaff_retaddr);
      *(undefined8 *)(in_RDI + 0x38) = 0;
      *(undefined4 *)(in_RDI + 0x34) = 0;
    }
  }
  return iVar2;
}

Assistant:

static int fts3SegReaderIncrRead(Fts3SegReader *pReader){
  int nRead;                      /* Number of bytes to read */
  int rc;                         /* Return code */

  nRead = MIN(pReader->nNode - pReader->nPopulate, FTS3_NODE_CHUNKSIZE);
  rc = sqlite3_blob_read(
      pReader->pBlob,
      &pReader->aNode[pReader->nPopulate],
      nRead,
      pReader->nPopulate
  );

  if( rc==SQLITE_OK ){
    pReader->nPopulate += nRead;
    memset(&pReader->aNode[pReader->nPopulate], 0, FTS3_NODE_PADDING);
    if( pReader->nPopulate==pReader->nNode ){
      sqlite3_blob_close(pReader->pBlob);
      pReader->pBlob = 0;
      pReader->nPopulate = 0;
    }
  }
  return rc;
}